

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_type.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::set_ssl_hostname_visitor::operator()
          (set_ssl_hostname_visitor *this,ssl_stream<libtorrent::aux::utp_stream> *s)

{
  context_handle_type pSVar1;
  allocator<char> local_59;
  host_name_verification local_58;
  string local_38 [32];
  
  ::std::__cxx11::string::string<std::allocator<char>>(local_38,this->hostname_,&local_59);
  ::std::__cxx11::string::string((string *)&local_58,local_38);
  ssl_stream<libtorrent::aux::utp_stream>::
  set_verify_callback<boost::asio::ssl::host_name_verification>(s,&local_58,this->ec_);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string(local_38);
  this->ssl_ = (((s->m_sock)._M_t.
                 super___uniq_ptr_impl<boost::asio::ssl::stream<libtorrent::aux::utp_stream>,_std::default_delete<boost::asio::ssl::stream<libtorrent::aux::utp_stream>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_boost::asio::ssl::stream<libtorrent::aux::utp_stream>_*,_std::default_delete<boost::asio::ssl::stream<libtorrent::aux::utp_stream>_>_>
                 .
                 super__Head_base<0UL,_boost::asio::ssl::stream<libtorrent::aux::utp_stream>_*,_false>
                ._M_head_impl)->core_).engine_.ssl_;
  pSVar1 = ssl_stream<libtorrent::aux::utp_stream>::context_handle(s);
  this->ctx_ = pSVar1;
  return;
}

Assistant:

void operator()(ssl_stream<T>& s)
		{
			s.set_verify_callback(ssl::host_name_verification(hostname_), *ec_);
			ssl_ = s.handle();
			ctx_ = s.context_handle();
		}